

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfio.c
# Opt level: O0

zfp * zfopen(char *path,char *mode)

{
  FILE *pFVar1;
  size_t sVar2;
  gzFile pgVar3;
  char local_432;
  char local_431;
  zfp *pzStack_430;
  uchar magic [2];
  zfp *zf;
  char path2 [1024];
  char *mode_local;
  char *path_local;
  
  pzStack_430 = (zfp *)malloc(0x10);
  if (pzStack_430 == (zfp *)0x0) {
    return (zfp *)0x0;
  }
  pzStack_430->fp = (FILE *)0x0;
  pzStack_430->gz = (gzFile)0x0;
  if ((*mode != 'z') && (mode[1] != 'z')) {
    pFVar1 = fopen(path,mode);
    pzStack_430->fp = (FILE *)pFVar1;
    if (pFVar1 != (FILE *)0x0) {
      sVar2 = fread(&local_432,1,2,(FILE *)pzStack_430->fp);
      if (sVar2 != 2) {
        free(pzStack_430);
        return (zfp *)0x0;
      }
      if ((local_432 != '\x1f') || (local_431 != -0x75)) {
        fseeko((FILE *)pzStack_430->fp,0,0);
        return pzStack_430;
      }
      fclose((FILE *)pzStack_430->fp);
      pzStack_430->fp = (FILE *)0x0;
    }
  }
  pgVar3 = (gzFile)gzopen(path,mode);
  pzStack_430->gz = pgVar3;
  if (pgVar3 == (gzFile)0x0) {
    sprintf((char *)&zf,"%.*s.gz",0x3fc,path);
    pgVar3 = (gzFile)gzopen(&zf,mode);
    pzStack_430->gz = pgVar3;
    if (pgVar3 == (gzFile)0x0) {
      perror(path);
      free(pzStack_430);
      path_local = (char *)0x0;
    }
    else {
      path_local = (char *)pzStack_430;
    }
  }
  else {
    path_local = (char *)pzStack_430;
  }
  return (zfp *)path_local;
}

Assistant:

zfp *zfopen(const char *path, const char *mode) {
    char path2[1024];
    zfp *zf;

    if (!(zf = (zfp *)malloc(sizeof(*zf))))
	return NULL;
    zf->fp = NULL;
    zf->gz = NULL;

    /* Try normal fopen */
    if (mode[0] != 'z' && mode[1] != 'z' &&
	NULL != (zf->fp = fopen(path, mode))) {
	unsigned char magic[2];
	if (2 != fread(magic, 1, 2, zf->fp)) {
	    free(zf);
	    return NULL;
	}
	if (!(magic[0] == 0x1f &&
	      magic[1] == 0x8b)) {
	    fseeko(zf->fp, 0, SEEK_SET);
	    return zf;
	}

	fclose(zf->fp);
	zf->fp = NULL;
    }

#ifdef HAVE_POPEN
    /*
     * I've no idea why, by gzgets is VERY slow, maybe because it handles
     * arbitrary seeks.
     * popen to gzip -cd is 3 times faster though.
     */
    if (*mode == 'w') {
    } else {
	if (access(path, R_OK) == 0) {
	    sprintf(path2, "gzip -cd < %.*s", 1000, path);
	    if (NULL != (zf->fp = popen(path2, "r")))
		return zf;
	}
	
	sprintf(path2, "gzip -cd < %.*s.gz", 1000, path);
	if (NULL != (zf->fp = popen(path2, "r")))
	    return zf;

	printf("Failed on %s\n", path);
    } else {
	sprintf(path2, "gzip > %.*s", 1000, path);
	if (NULL != (zf->fp = popen(path2, "w")))
	    return zf;
	}
	
	printf("Failed on %s\n", path);
    }
#else
    /* Gzopen instead */
    if ((zf->gz = gzopen(path, mode)))
	return zf;

    sprintf(path2, "%.*s.gz", 1020, path);
    if ((zf->gz = gzopen(path2, mode)))
	return zf;
#endif

    perror(path);

    free(zf);
    return NULL;
}